

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shared_alloc.hpp
# Opt level: O1

void __thiscall
__gnu_cxx::new_allocator<Omega_h::Children>::construct<Omega_h::Children,Omega_h::Children&>
          (new_allocator<Omega_h::Children> *this,Children *__p,Children *__args)

{
  Alloc *pAVar1;
  
  pAVar1 = (__args->super_Graph).a2ab.write_.shared_alloc_.alloc;
  (__p->super_Graph).a2ab.write_.shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (Omega_h::entering_parallel == '\x01') {
      (__p->super_Graph).a2ab.write_.shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (__p->super_Graph).a2ab.write_.shared_alloc_.direct_ptr =
       (__args->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  pAVar1 = (__args->super_Graph).ab2b.write_.shared_alloc_.alloc;
  (__p->super_Graph).ab2b.write_.shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (Omega_h::entering_parallel == '\x01') {
      (__p->super_Graph).ab2b.write_.shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (__p->super_Graph).ab2b.write_.shared_alloc_.direct_ptr =
       (__args->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  pAVar1 = (__args->codes).write_.shared_alloc_.alloc;
  (__p->codes).write_.shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (Omega_h::entering_parallel == '\x01') {
      (__p->codes).write_.shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (__p->codes).write_.shared_alloc_.direct_ptr = (__args->codes).write_.shared_alloc_.direct_ptr;
  return;
}

Assistant:

OMEGA_H_INLINE void copy(SharedAlloc const& other) noexcept {
    alloc = other.alloc;
#ifndef __CUDA_ARCH__
    if (alloc && (!(reinterpret_cast<std::uintptr_t>(alloc) & FREE_MASK))) {
      // allocated
      if (entering_parallel) {
        alloc = reinterpret_cast<Alloc*>(
            (std::uintptr_t(alloc->size) << 3) | IN_PARALLEL);
      } else {
        ++(alloc->use_count);
      }
    }
#endif
    direct_ptr = other.direct_ptr;
  }